

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Browser.cxx
# Opt level: O2

void __thiscall
Fl_File_Browser::Fl_File_Browser(Fl_File_Browser *this,int X,int Y,int W,int H,char *l)

{
  Fl_Browser::Fl_Browser(&this->super_Fl_Browser,X,Y,W,H,l);
  (this->super_Fl_Browser).super_Fl_Browser_.super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget =
       (_func_int **)&PTR__Fl_Browser_00258dc8;
  this->pattern_ = "*";
  this->directory_ = "";
  this->iconsize_ = (uchar)(((this->super_Fl_Browser).super_Fl_Browser_.textsize_ * 3) / 2);
  *(undefined4 *)&(this->super_Fl_Browser).field_0x29c = 0;
  return;
}

Assistant:

Fl_File_Browser::Fl_File_Browser(int        X,  // I - Upper-lefthand X coordinate
                        	 int        Y,  // I - Upper-lefthand Y coordinate
				 int        W,  // I - Width in pixels
				 int        H,  // I - Height in pixels
				 const char *l)	// I - Label text
    : Fl_Browser(X, Y, W, H, l)
{
  // Initialize the filter pattern, current directory, and icon size...
  pattern_   = "*";
  directory_ = "";
  iconsize_  = (uchar)(3 * textsize() / 2);
  filetype_  = FILES;
}